

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

char * doctest::skipPathFromFilename(char *file)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (*(char *)(detail::g_cs + 0x81) == '\x01') {
    pcVar1 = strrchr(file,0x5c);
    pcVar2 = strrchr(file,0x2f);
    pcVar3 = pcVar2;
    if (pcVar2 < pcVar1) {
      pcVar3 = pcVar1;
    }
    if (pcVar1 != (char *)0x0 || pcVar2 != (char *)0x0) {
      file = pcVar3 + 1;
    }
  }
  return file;
}

Assistant:

const char* skipPathFromFilename(const char* file) {
#ifndef DOCTEST_CONFIG_DISABLE
    if(getContextOptions()->no_path_in_filenames) {
        auto back    = std::strrchr(file, '\\');
        auto forward = std::strrchr(file, '/');
        if(back || forward) {
            if(back > forward)
                forward = back;
            return forward + 1;
        }
    }
#endif // DOCTEST_CONFIG_DISABLE
    return file;
}